

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::SetIsPrototype
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,DynamicObject *instance)

{
  DictionaryTypeHandlerBase<unsigned_short>::SetIsPrototype
            (&this->super_DictionaryTypeHandlerBase<unsigned_short>,instance);
  ScriptContextOptimizationOverrideInfo::DisableArraySetElementFastPath
            (&((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr)->optimizationOverrides);
  return;
}

Assistant:

void ES5ArrayTypeHandlerBase<T>::SetIsPrototype(DynamicObject * instance)
    {
        __super::SetIsPrototype(instance);

        // We have ES5 array has array/object prototype, we can't use array fast path for set
        // as index could be readonly or be getter/setter in the prototype
        // TODO: we may be able to separate out the array fast path and the object array fast path
        // here.
        instance->GetScriptContext()->optimizationOverrides.DisableArraySetElementFastPath();
    }